

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_GlobalMemoryAccountant_reportWithCacheSizes_TestShell::createTest
          (TEST_GlobalMemoryAccountant_reportWithCacheSizes_TestShell *this)

{
  TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test *this_00;
  
  this_00 = (TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test *)
            operator_new(0x98,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                         ,0x2aa);
  TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test::
  TEST_GlobalMemoryAccountant_reportWithCacheSizes_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(GlobalMemoryAccountant, reportWithCacheSizes)
{
    size_t cacheSizes[] = {512};
    accountant.useCacheSizes(cacheSizes, 1);
    accountant.start();
    char* memory = new char[185];
    delete [] memory;
    accountant.stop();

    /* Allocation includes memory leak info */
    STRCMP_CONTAINS("512                   1                1                 1", accountant.report().asCharString());
}